

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSceneCombiner.cpp
# Opt level: O0

void __thiscall
utSceneCombiner_CopySceneWithNullptr_AI_NO_EXCEPTion_Test::TestBody
          (utSceneCombiner_CopySceneWithNullptr_AI_NO_EXCEPTion_Test *this)

{
  bool bVar1;
  AssertHelper local_40;
  Message local_38;
  AssertHelper local_30;
  Message local_28 [3];
  utSceneCombiner_CopySceneWithNullptr_AI_NO_EXCEPTion_Test *local_10;
  utSceneCombiner_CopySceneWithNullptr_AI_NO_EXCEPTion_Test *this_local;
  
  local_10 = this;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Assimp::SceneCombiner::CopyScene((aiScene **)0x0,(aiScene *)0x0,true);
    }
  }
  else {
    testing::Message::Message(local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSceneCombiner.cpp"
               ,0x4d,
               "Expected: SceneCombiner::CopyScene( nullptr, nullptr ) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_30,local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::Message::~Message(local_28);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Assimp::SceneCombiner::CopySceneFlat((aiScene **)0x0,(aiScene *)0x0);
    }
  }
  else {
    testing::Message::Message(&local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSceneCombiner.cpp"
               ,0x4e,
               "Expected: SceneCombiner::CopySceneFlat( nullptr, nullptr ) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_40,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message(&local_38);
  }
  return;
}

Assistant:

TEST_F( utSceneCombiner, CopySceneWithNullptr_AI_NO_EXCEPTion ) {
    EXPECT_NO_THROW( SceneCombiner::CopyScene( nullptr, nullptr ) );
    EXPECT_NO_THROW( SceneCombiner::CopySceneFlat( nullptr, nullptr ) );
}